

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_ranges.c
# Opt level: O3

int dwarf_get_ranges_baseaddress
              (Dwarf_Debug dw_dbg,Dwarf_Die dw_die,Dwarf_Bool *dw_known_base,
              Dwarf_Unsigned *dw_baseaddress,Dwarf_Bool *dw_at_ranges_offset_present,
              Dwarf_Unsigned *dw_at_ranges_offset,Dwarf_Error *dw_error)

{
  Dwarf_CU_Context_conflict pDVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Dwarf_Bool DVar5;
  char *msg;
  Dwarf_Unsigned DVar6;
  Dwarf_Signed errval;
  Dwarf_Error err;
  Dwarf_Unsigned *pDVar7;
  Dwarf_Attribute attr;
  Dwarf_Bool haslowpc;
  Dwarf_Bool hasatranges;
  Dwarf_Unsigned die_ranges_offset;
  Dwarf_Unsigned rangeoffset_local;
  Dwarf_Attribute local_68;
  int local_5c;
  Dwarf_Bool local_58;
  Dwarf_Bool local_54;
  Dwarf_Unsigned local_50;
  Dwarf_Addr local_48;
  Dwarf_Off local_40;
  Dwarf_Bool *local_38;
  
  local_50 = 0;
  if ((dw_dbg == (Dwarf_Debug)0x0) || (dw_dbg->de_magic != 0xebfdebfd)) {
    msg = 
    "DW_DLE_DBG_NULL: dbg argument to dwarf_get_ranges_baseaddress()either null or it containsa stale Dwarf_Debug pointer"
    ;
    errval = 0x51;
    dw_dbg = (Dwarf_Debug)0x0;
    goto LAB_001c0af0;
  }
  if (dw_die == (Dwarf_Die)0x0) {
    if (dw_known_base != (Dwarf_Bool *)0x0) {
      *dw_known_base = 0;
      *dw_at_ranges_offset_present = 0;
    }
    if (dw_baseaddress == (Dwarf_Unsigned *)0x0) {
      return 0;
    }
    *dw_baseaddress = 0;
    *dw_at_ranges_offset = 0;
    return 0;
  }
  local_54 = 0;
  local_58 = 0;
  local_68 = (Dwarf_Attribute)0x0;
  local_40 = 0;
  local_48 = 0;
  local_38 = dw_known_base;
  iVar4 = dwarf_hasattr(dw_die,0x55,&local_54,dw_error);
  if (iVar4 == 0) {
    if (local_54 == 0) goto LAB_001c0ba4;
    iVar4 = dwarf_attr(dw_die,0x55,&local_68,dw_error);
    if (iVar4 == 1) {
LAB_001c0b7b:
      dwarf_dealloc_error(dw_dbg,*dw_error);
      *dw_error = (Dwarf_Error)0x0;
      err = (Dwarf_Error)0x0;
      goto LAB_001c0b91;
    }
    if (iVar4 == 0) {
      local_5c = dwarf_global_formref(local_68,&local_40,dw_error);
      dwarf_dealloc_attribute(local_68);
      if (local_5c == 1) goto LAB_001c0b7b;
      local_68 = (Dwarf_Attribute)0x0;
      local_50 = local_40;
      iVar4 = dwarf_hasattr(dw_die,0x11,&local_58,dw_error);
      if ((iVar4 != 0) || (iVar4 = dwarf_lowpc(dw_die,&local_48,dw_error), iVar4 != 0)) {
        if (iVar4 == 1) {
          dwarf_dealloc_error(dw_dbg,*dw_error);
          *dw_error = (Dwarf_Error)0x0;
        }
        bVar2 = false;
        goto LAB_001c0c92;
      }
      bVar2 = false;
      bVar3 = false;
      DVar6 = local_48;
    }
    else {
      bVar2 = true;
LAB_001c0c92:
      bVar3 = true;
      DVar6 = 0;
    }
  }
  else {
    if (iVar4 == 1) {
      err = *dw_error;
LAB_001c0b91:
      dwarf_dealloc_error(dw_dbg,err);
      *dw_error = (Dwarf_Error)0x0;
    }
LAB_001c0ba4:
    bVar3 = true;
    bVar2 = true;
    DVar6 = 0;
  }
  pDVar1 = dw_die->di_cu_context;
  if (pDVar1 != (Dwarf_CU_Context_conflict)0x0) {
    if (bVar2) {
      DVar5 = pDVar1->cc_at_ranges_offset_present;
      pDVar7 = &pDVar1->cc_at_ranges_offset;
    }
    else {
      DVar5 = 1;
      pDVar7 = &local_50;
    }
    if (dw_at_ranges_offset != (Dwarf_Unsigned *)0x0) {
      *dw_at_ranges_offset = *pDVar7;
    }
    if (dw_at_ranges_offset_present != (Dwarf_Bool *)0x0) {
      *dw_at_ranges_offset_present = DVar5;
    }
    DVar5 = 1;
    if (bVar3) {
      if (pDVar1->cc_low_pc_present == 0) {
        DVar6 = 0;
        DVar5 = 0;
      }
      else {
        DVar6 = pDVar1->cc_low_pc;
      }
    }
    if (dw_baseaddress == (Dwarf_Unsigned *)0x0) {
      return 0;
    }
    *dw_baseaddress = DVar6;
    *local_38 = DVar5;
    return 0;
  }
  msg = "DW_DLE_DIE_NO_CU_CONTEXT: in a call to dwarf_get_ranges_baseaddress";
  errval = 0x68;
LAB_001c0af0:
  _dwarf_error_string(dw_dbg,dw_error,errval,msg);
  return 1;
}

Assistant:

int
dwarf_get_ranges_baseaddress(Dwarf_Debug dw_dbg,
    Dwarf_Die       dw_die,
    Dwarf_Bool     *dw_known_base,
    Dwarf_Unsigned *dw_baseaddress,
    Dwarf_Bool     *dw_at_ranges_offset_present,
    Dwarf_Unsigned *dw_at_ranges_offset,
    Dwarf_Error    *dw_error)
{
    Dwarf_CU_Context context = 0;
    Dwarf_Unsigned local_ranges_offset = 0;
    Dwarf_Bool     local_ranges_offset_present = FALSE;
    Dwarf_Unsigned local_base_addr= 0;
    Dwarf_Bool     local_base_addr_present = FALSE;
    Dwarf_Bool     have_die_ranges_offset = FALSE;
    Dwarf_Unsigned die_ranges_offset = 0;
    Dwarf_Bool     have_die_base_addr = FALSE;
    Dwarf_Unsigned die_base_addr = 0;
    int            res = 0;

    CHECK_DBG(dw_dbg,dw_error,"dwarf_get_ranges_baseaddress()");
    if (!dw_die) {
        if (dw_known_base) {
            *dw_known_base = FALSE;
            *dw_at_ranges_offset_present = FALSE;
        }
        if (dw_baseaddress) {
            *dw_baseaddress = 0;
            *dw_at_ranges_offset = 0;
        }
        return DW_DLV_OK;
    }
    /*  If the DIE passed in has a DW_AT_ranges attribute
        we will use that DIE ranges offset.
        Otherwise we use the DW_AT_ranges from the
        CU DIE (if any)
        If the DIE passed in has a DW_AT_low_pc
        attribute we will use that as the ranges
        base address, otherwise we use the
        cu context base adddress (if present) ...
        which may be incorrect... ? */
    res = _dwarf_determine_die_range_offset(dw_dbg,
        dw_die,&have_die_ranges_offset,&die_ranges_offset,
        &have_die_base_addr,&die_base_addr,dw_error);
    if (res != DW_DLV_OK ) {
        if (res == DW_DLV_ERROR) {
            /*  Suppressing knowledge of any error */
            dwarf_dealloc_error(dw_dbg,*dw_error);
            *dw_error = 0;
        }
    }

    context = dw_die->di_cu_context;
    if (!context) {
        _dwarf_error_string(dw_dbg, dw_error,
            DW_DLE_DIE_NO_CU_CONTEXT,
            "DW_DLE_DIE_NO_CU_CONTEXT: in a call to "
            "dwarf_get_ranges_baseaddress");
        return DW_DLV_ERROR;
    }
    if (have_die_ranges_offset) {
        local_ranges_offset_present = have_die_ranges_offset;
        local_ranges_offset = die_ranges_offset;
    } else {
        local_ranges_offset_present =
            context->cc_at_ranges_offset_present;
        local_ranges_offset =
            context->cc_at_ranges_offset;
    }
    if (dw_at_ranges_offset) {
        *dw_at_ranges_offset = local_ranges_offset;
    }
    if (dw_at_ranges_offset_present) {
        *dw_at_ranges_offset_present = local_ranges_offset_present;
    }
    if (have_die_base_addr) {
        local_base_addr_present = have_die_base_addr;
        local_base_addr = die_base_addr;
    } else {
        if (context->cc_low_pc_present ) {
            local_base_addr_present = TRUE;
            local_base_addr = context->cc_low_pc;
        }
    }
    if (dw_baseaddress) {
        /*  Unless cc_low_pc_present is TRUE
            cc_low_pc is always zero, and it
            could be zero regardless. */

        *dw_baseaddress = local_base_addr;
        *dw_known_base = local_base_addr_present;
    }
    return DW_DLV_OK;
}